

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

void mbedtls_psa_crypto_free(void)

{
  psa_wipe_all_key_slots();
  if ((global_data._1392_1_ & 6) != 0) {
    mbedtls_ctr_drbg_free(&global_data.ctr_drbg);
    (*global_data.entropy_free)((mbedtls_entropy_context *)0x154240);
  }
  mbedtls_platform_zeroize(&global_data,0x578);
  return;
}

Assistant:

void mbedtls_psa_crypto_free( void )
{
    psa_wipe_all_key_slots( );
    if( global_data.rng_state != RNG_NOT_INITIALIZED )
    {
        mbedtls_ctr_drbg_free( &global_data.ctr_drbg );
        global_data.entropy_free( &global_data.entropy );
    }
    /* Wipe all remaining data, including configuration.
     * In particular, this sets all state indicator to the value
     * indicating "uninitialized". */
    mbedtls_platform_zeroize( &global_data, sizeof( global_data ) );
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    /* Unregister all secure element drivers, so that we restart from
     * a pristine state. */
    psa_unregister_all_se_drivers( );
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
}